

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O3

void __thiscall QProcessPrivate::QProcessPrivate(QProcessPrivate *this)

{
  QIODevicePrivate::QIODevicePrivate(&this->super_QIODevicePrivate,QObjectPrivateVersion);
  (this->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData._vptr_QObjectData =
       (_func_int **)&PTR__QProcessPrivate_0069fc70;
  (this->stdinChannel).file.d.d = (Data *)0x0;
  (this->stdinChannel).file.d.ptr = (char16_t *)0x0;
  (this->stdinChannel).file.d.size = 0;
  (this->stdinChannel).process = (QProcessPrivate *)0x0;
  (this->stdinChannel).notifier = (QSocketNotifier *)0x0;
  (this->stdinChannel).pipe[0] = -1;
  (this->stdinChannel).pipe[1] = -1;
  (this->stdinChannel).type = Normal;
  (this->stdinChannel).closed = false;
  (this->stdinChannel).append = false;
  (this->stdoutChannel).file.d.d = (Data *)0x0;
  (this->stdoutChannel).file.d.ptr = (char16_t *)0x0;
  (this->stdoutChannel).file.d.size = 0;
  (this->stdoutChannel).process = (QProcessPrivate *)0x0;
  (this->stdoutChannel).notifier = (QSocketNotifier *)0x0;
  (this->stdoutChannel).pipe[0] = -1;
  (this->stdoutChannel).pipe[1] = -1;
  (this->stdoutChannel).type = Normal;
  (this->stdoutChannel).closed = false;
  (this->stdoutChannel).append = false;
  (this->stderrChannel).file.d.d = (Data *)0x0;
  (this->stderrChannel).file.d.ptr = (char16_t *)0x0;
  (this->stderrChannel).file.d.size = 0;
  (this->stderrChannel).process = (QProcessPrivate *)0x0;
  (this->stderrChannel).notifier = (QSocketNotifier *)0x0;
  (this->stderrChannel).pipe[0] = -1;
  (this->stderrChannel).pipe[1] = -1;
  (this->stderrChannel).type = Normal;
  (this->stderrChannel).closed = false;
  (this->stderrChannel).append = false;
  (this->program).d.d = (Data *)0x0;
  (this->program).d.ptr = (char16_t *)0x0;
  (this->program).d.size = 0;
  (this->arguments).d.d = (Data *)0x0;
  (this->arguments).d.ptr = (QString *)0x0;
  (this->arguments).d.size = 0;
  (this->workingDirectory).d.d = (Data *)0x0;
  (this->workingDirectory).d.ptr = (char16_t *)0x0;
  (this->workingDirectory).d.size = 0;
  QProcessEnvironment::QProcessEnvironment(&this->environment,InheritFromParent);
  (this->unixExtras)._M_t.
  super___uniq_ptr_impl<QProcessPrivate::UnixExtras,_std::default_delete<QProcessPrivate::UnixExtras>_>
  ._M_t.
  super__Tuple_impl<0UL,_QProcessPrivate::UnixExtras_*,_std::default_delete<QProcessPrivate::UnixExtras>_>
  .super__Head_base<0UL,_QProcessPrivate::UnixExtras_*,_false>._M_head_impl = (UnixExtras *)0x0;
  this->stateNotifier = (QSocketNotifier *)0x0;
  this->childStartedPipe[0] = -1;
  this->childStartedPipe[1] = -1;
  this->pid = 0;
  this->forkfd = -1;
  this->exitCode = 0;
  this->processState = '\0';
  this->exitStatus = '\0';
  this->processError = '\x05';
  this->processChannelMode = '\0';
  this->inputChannelMode = '\0';
  this->emittedReadyRead = false;
  this->emittedBytesWritten = false;
  (this->super_QIODevicePrivate).readBufferChunkSize = 0x1000;
  (this->super_QIODevicePrivate).writeBufferChunkSize = 0x1000;
  return;
}

Assistant:

QProcessPrivate::QProcessPrivate()
{
    readBufferChunkSize = QRINGBUFFER_CHUNKSIZE;
#ifndef Q_OS_WIN
    writeBufferChunkSize = QRINGBUFFER_CHUNKSIZE;
#endif
}